

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int vm_builtin_json_decode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *zInput;
  ProcSort in_R8;
  ProcCmp in_R9;
  SySet sToken;
  int nByte;
  json_decoder sDecoder;
  int local_c4;
  SySet local_c0;
  sxu32 local_94;
  SyLex local_90;
  json_decoder local_50;
  
  if (((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) &&
     (zInput = jx9_value_to_string(*apArg,(int *)&local_94), 0 < (int)local_94)) {
    local_c0.pAllocator = &pCtx->pVm->sAllocator;
    local_90.sStream.pSet = &local_c0;
    local_c0.eSize = 0x20;
    local_c0.nCursor = 0;
    local_c0.pBase = (SyToken *)0x0;
    local_c0.nUsed = 0;
    local_c0.nSize = 0;
    local_c0.pUserData = (void *)0x0;
    local_c4 = 0;
    local_90.xTokenizer = VmJsonTokenize;
    local_90.sStream.nLine = 1;
    local_90.sStream.nIgn = 0;
    local_90.sStream.zText = (uchar *)0x0;
    local_90.sStream.zEnd = (uchar *)0x0;
    local_90.pUserData = &local_c4;
    local_90.pTokenSet = local_90.sStream.pSet;
    SyLexTokenizeInput(&local_90,zInput,local_94,VmJsonTokenize,in_R8,in_R9);
    if (local_c4 == 0) {
      local_50.pIn = (SyToken *)local_c0.pBase;
      local_50.pEnd = (SyToken *)((long)local_c0.pBase + (local_c0._16_8_ & 0xffffffff) * 0x20);
      local_50.iFlags = 0;
      local_50.rec_count = 0;
      local_50.xConsumer = VmJsonDefaultDecoder;
      local_50.pUserData = (void *)0x0;
      local_50.pCtx = pCtx;
      local_50.pErr = &local_c4;
      local_c4 = VmJsonDecode(&local_50,(jx9_value *)0x0);
      if (local_c4 == -10) {
        jx9MemObjRelease(pCtx->pRet);
      }
      if ((jx9_vm *)local_c0.pAllocator == (jx9_vm *)0x0) {
        return 0;
      }
      if ((SyToken *)local_c0.pBase == (SyToken *)0x0) {
        return 0;
      }
      SyMemBackendFree(local_c0.pAllocator,local_c0.pBase);
      return 0;
    }
    if (((jx9_vm *)local_c0.pAllocator != (jx9_vm *)0x0) &&
       ((SyToken *)local_c0.pBase != (SyToken *)0x0)) {
      SyMemBackendFree(local_c0.pAllocator,local_c0.pBase);
    }
    local_c0.pBase = (void *)0x0;
    local_c0._16_8_ = local_c0._16_8_ & 0xffffffff00000000;
    local_c0._24_8_ = local_c0._24_8_ & 0xffffffff;
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int vm_builtin_json_decode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zJSON;
	int nByte;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the JSON string */
	zJSON = jx9_value_to_string(apArg[0], &nByte);
	if( nByte < 1 ){
		/* Empty string, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Decode the raw JSON */
	jx9JsonDecode(pCtx,zJSON,nByte);
	return JX9_OK;
}